

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Remove_Nurse
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  pointer pNVar1;
  long lVar2;
  __type _Var3;
  ulong uVar4;
  long lVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  uVar4 = 0xffffffffffffffff;
  lVar2 = -0x158;
  do {
    lVar5 = lVar2;
    pNVar1 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = uVar4 + 1;
    if ((ulong)(((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pNVar1) / 0x158) <= uVar4) {
      return;
    }
    Nurse::nurse_all_ino_getter_abi_cxx11_
              (&local_48,(Nurse *)((long)&pNVar1[1].super_Human.Id._M_dataplus + lVar5));
    _Var3 = std::operator==(local_48.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    lVar2 = lVar5 + 0x158;
  } while (!_Var3);
  std::vector<Nurse,_std::allocator<Nurse>_>::erase
            (All_Of_Nurses,
             (Nurse *)((long)&(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>).
                              _M_impl.super__Vector_impl_data._M_start[1].super_Human.Id._M_dataplus
                      + lVar5));
  return;
}

Assistant:

void Hospital :: Remove_Nurse(vector<Nurse>& All_Of_Nurses , string id){

    for (int i = 0; i <All_Of_Nurses.size() ; ++i) {
        if(All_Of_Nurses[i].nurse_all_ino_getter()[0] == id){
            All_Of_Nurses.erase(All_Of_Nurses.begin()+i);
            ///remove from files
            break;
        }
    }
}